

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O1

char * lws_get_mimetype(char *file,lws_http_mount *m)

{
  int iVar1;
  size_t sVar2;
  size_t sVar3;
  char *pcVar4;
  char *pcVar5;
  lws_protocol_vhost_options *plVar6;
  long lVar7;
  
  sVar2 = strlen(file);
  if (m == (lws_http_mount *)0x0) {
    plVar6 = (lws_protocol_vhost_options *)0x0;
  }
  else {
    plVar6 = m->extra_mimetypes;
  }
  pcVar4 = (char *)0x0;
  for (; plVar6 != (lws_protocol_vhost_options *)0x0; plVar6 = plVar6->next) {
    if ((pcVar4 == (char *)0x0) && (*plVar6->name == '*')) {
      pcVar4 = plVar6->value;
    }
    else {
      pcVar5 = plVar6->name;
      sVar3 = strlen(pcVar5);
      if ((sVar3 <= sVar2 && sVar2 - sVar3 != 0) &&
         (iVar1 = strcasecmp(file + (sVar2 - sVar3),pcVar5), iVar1 == 0)) {
        _lws_log(8,"%s: match to user mimetype: %s\n","lws_get_mimetype",plVar6->value);
        return plVar6->value;
      }
    }
  }
  lVar7 = 8;
  while( true ) {
    pcVar5 = *(char **)(&UNK_00155b58 + lVar7);
    sVar3 = strlen(pcVar5);
    if ((sVar3 <= sVar2 && sVar2 - sVar3 != 0) &&
       (iVar1 = strcasecmp(file + (sVar2 - sVar3),pcVar5), iVar1 == 0)) break;
    lVar7 = lVar7 + 0x10;
    if (lVar7 == 0x128) {
      if (pcVar4 == (char *)0x0) {
        pcVar4 = (char *)0x0;
      }
      else {
        pcVar5 = "%s: match to any mimetype: %s\n";
LAB_00134421:
        _lws_log(8,pcVar5,"lws_get_mimetype",pcVar4);
      }
      return pcVar4;
    }
  }
  pcVar4 = *(char **)((long)&server_mimetypes[0].extension + lVar7);
  pcVar5 = "%s: match to server mimetype: %s\n";
  goto LAB_00134421;
}

Assistant:

const char *
lws_get_mimetype(const char *file, const struct lws_http_mount *m)
{
	const struct lws_protocol_vhost_options *pvo;
	size_t n = strlen(file), len, i;
	const char *fallback_mimetype = NULL;
	const struct lws_mimetype *mt;

	/* prioritize user-defined mimetypes */
	for (pvo = m ? m->extra_mimetypes : NULL; pvo; pvo = pvo->next) {
		/* ie, match anything */
		if (!fallback_mimetype && pvo->name[0] == '*') {
			fallback_mimetype = pvo->value;
			continue;
		}

		len = strlen(pvo->name);
		if (n > len && !strcasecmp(&file[n - len], pvo->name)) {
			lwsl_info("%s: match to user mimetype: %s\n", __func__,
				  pvo->value);
			return pvo->value;
		}
	}

	/* fallback to server-defined mimetypes */
	for (i = 0; i < LWS_ARRAY_SIZE(server_mimetypes); ++i) {
		mt = &server_mimetypes[i];

		len = strlen(mt->extension);
		if (n > len && !strcasecmp(&file[n - len], mt->extension)) {
			lwsl_info("%s: match to server mimetype: %s\n", __func__,
				  mt->mimetype);
			return mt->mimetype;
		}
	}

	/* fallback to '*' if defined */
	if (fallback_mimetype) {
		lwsl_info("%s: match to any mimetype: %s\n", __func__,
			  fallback_mimetype);
		return fallback_mimetype;
	}

	return NULL;
}